

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

int xmlShellSetContent(xmlShellCtxtPtr ctxt,char *value,xmlNodePtr node,xmlNodePtr node2)

{
  xmlParserErrors xVar1;
  int iVar2;
  size_t sVar3;
  xmlNodePtr pxVar4;
  xmlNodePtr results;
  xmlNodePtr local_20;
  
  if ((node != (xmlNodePtr)0x0) && (value != (char *)0x0)) {
    sVar3 = strlen(value);
    xVar1 = xmlParseInNodeContext(node,value,(int)sVar3,0,&local_20);
    if (xVar1 == XML_ERR_OK) {
      if (node->children != (xmlNodePtr)0x0) {
        xmlFreeNodeList(node->children);
        node->children = (_xmlNode *)0x0;
        node->last = (_xmlNode *)0x0;
      }
      pxVar4 = xmlAddChildList(node,local_20);
      iVar2 = (int)pxVar4;
    }
    else {
      sVar3 = fwrite("failed to parse content\n",0x18,1,(FILE *)ctxt->output);
      iVar2 = (int)sVar3;
    }
    return iVar2;
  }
  sVar3 = fwrite("NULL\n",5,1,(FILE *)ctxt->output);
  return (int)sVar3;
}

Assistant:

static int
xmlShellSetContent(xmlShellCtxtPtr ctxt ATTRIBUTE_UNUSED,
            char *value, xmlNodePtr node,
            xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlNodePtr results;
    xmlParserErrors ret;

    if (!ctxt)
        return (0);
    if (node == NULL) {
	fprintf(ctxt->output, "NULL\n");
	return (0);
    }
    if (value == NULL) {
        fprintf(ctxt->output, "NULL\n");
	return (0);
    }

    ret = xmlParseInNodeContext(node, value, strlen(value), 0, &results);
    if (ret == XML_ERR_OK) {
	if (node->children != NULL) {
	    xmlFreeNodeList(node->children);
	    node->children = NULL;
	    node->last = NULL;
	}
	xmlAddChildList(node, results);
    } else {
        fprintf(ctxt->output, "failed to parse content\n");
    }
    return (0);
}